

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitCatch(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name tag)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  ScopeCtx *pSVar4;
  Expression **ppEVar5;
  ExpressionList *this_00;
  SmallVector<unsigned_int,_1UL> *this_01;
  size_t i;
  uint *puVar6;
  Err *pEVar7;
  Tag *this_02;
  reference this_03;
  Expression *expr_00;
  Ok local_2e9;
  uintptr_t local_2e8;
  BasicType local_2dc;
  size_t local_2d8;
  char *pcStack_2d0;
  Type local_2c0;
  Type params;
  Err *err_1;
  undefined1 local_1e0 [8];
  Result<wasm::Ok> _val_1;
  mapped_type *delimiterLocs;
  Err local_198;
  Err *local_178;
  Err *err;
  Result<wasm::Expression_*> _val;
  Result<wasm::Expression_*> expr;
  Err local_118;
  Try *local_e8;
  Try *tryy;
  undefined1 local_d8 [7];
  bool wasTry;
  ScopeCtx scope;
  IRBuilder *this_local;
  Name tag_local;
  
  scope.startPos = (size_t)this;
  pSVar4 = getScope(this);
  ScopeCtx::ScopeCtx((ScopeCtx *)local_d8,pSVar4);
  tryy._7_1_ = 1;
  local_e8 = ScopeCtx::getTry((ScopeCtx *)local_d8);
  if (local_e8 == (Try *)0x0) {
    tryy._7_1_ = 0;
    local_e8 = ScopeCtx::getCatch((ScopeCtx *)local_d8);
  }
  if (local_e8 == (Try *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"unexpected catch",
               (allocator<char> *)
               ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x27));
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_118);
    wasm::Err::~Err(&local_118);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x27));
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index = '\x01';
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._33_3_ = 0;
  }
  else {
    finishScope((Result<wasm::Expression_*> *)
                ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),this,
                (Block *)0x0);
    Result<wasm::Expression_*>::Result
              ((Result<wasm::Expression_*> *)&err,
               (Result<wasm::Expression_*> *)
               ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
    local_178 = Result<wasm::Expression_*>::getErr((Result<wasm::Expression_*> *)&err);
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index = local_178 != (Err *)0x0;
    if ((bool)expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index) {
      wasm::Err::Err(&local_198,local_178);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_198);
      wasm::Err::~Err(&local_198);
    }
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._33_3_ = 0;
    Result<wasm::Expression_*>::~Result((Result<wasm::Expression_*> *)&err);
    if (expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_4_ == 0) {
      if ((tryy._7_1_ & 1) == 0) {
        this_00 = &local_e8->catchBodies;
        ppEVar5 = Result<wasm::Expression_*>::operator*
                            ((Result<wasm::Expression_*> *)
                             ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&this_00->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   *ppEVar5);
      }
      else {
        ppEVar5 = Result<wasm::Expression_*>::operator*
                            ((Result<wasm::Expression_*> *)
                             ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
        local_e8->body = *ppEVar5;
      }
      ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
                (&(local_e8->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                 tag);
      if ((this->binaryPos != (size_t *)0x0) && (this->func != (Function *)0x0)) {
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = local_e8;
        this_01 = &std::
                   unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
                   ::operator[](&this->func->delimiterLocations,
                                (key_type *)
                                ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20))->
                   super_SmallVector<unsigned_int,_1UL>;
        sVar1 = this->lastBinaryPos;
        sVar2 = this->codeSectionOffset;
        i = SmallVector<unsigned_int,_1UL>::size(this_01);
        puVar6 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[]
                           ((ZeroInitSmallVector<unsigned_int,_1UL> *)this_01,i);
        *puVar6 = (int)sVar1 - (int)sVar2;
      }
      ScopeCtx::makeCatch((ScopeCtx *)&err_1,(ScopeCtx *)local_d8,local_e8);
      pushScope((Result<wasm::Ok> *)local_1e0,this,(ScopeCtx *)&err_1);
      ScopeCtx::~ScopeCtx((ScopeCtx *)&err_1);
      pEVar7 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_1e0);
      if (pEVar7 != (Err *)0x0) {
        wasm::Err::Err((Err *)&params,pEVar7);
        Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)&params);
        wasm::Err::~Err((Err *)&params);
      }
      expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._33_3_ = 0;
      expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index = pEVar7 != (Err *)0x0;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_1e0);
      if (expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_4_ == 0) {
        local_2d8 = tag.super_IString.str._M_len;
        pcStack_2d0 = tag.super_IString.str._M_str;
        this_02 = Module::getTag(this->wasm,tag);
        local_2c0 = wasm::Tag::params(this_02);
        local_2dc = none;
        bVar3 = wasm::Type::operator!=(&local_2c0,&local_2dc);
        if (bVar3) {
          this_03 = std::
                    vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::
                    operator[](&this->scopeStack,0);
          ScopeCtx::notePop(this_03);
          local_2e8 = local_2c0.id;
          expr_00 = (Expression *)Builder::makePop(&this->builder,local_2c0);
          push(this,expr_00);
        }
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_2e9);
        expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index = '\x01';
        expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._33_3_ = 0;
      }
    }
    Result<wasm::Expression_*>::~Result
              ((Result<wasm::Expression_*> *)
               ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
  }
  ScopeCtx::~ScopeCtx((ScopeCtx *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitCatch(Name tag) {
  auto scope = getScope();
  bool wasTry = true;
  auto* tryy = scope.getTry();
  if (!tryy) {
    wasTry = false;
    tryy = scope.getCatch();
  }
  if (!tryy) {
    return Err{"unexpected catch"};
  }
  auto expr = finishScope();
  CHECK_ERR(expr);
  if (wasTry) {
    tryy->body = *expr;
  } else {
    tryy->catchBodies.push_back(*expr);
  }
  tryy->catchTags.push_back(tag);

  if (binaryPos && func) {
    auto& delimiterLocs = func->delimiterLocations[tryy];
    delimiterLocs[delimiterLocs.size()] = lastBinaryPos - codeSectionOffset;
  }

  CHECK_ERR(pushScope(ScopeCtx::makeCatch(std::move(scope), tryy)));
  // Push a pop for the exception payload if necessary.
  auto params = wasm.getTag(tag)->params();
  if (params != Type::none) {
    // Note that we have a pop to help determine later whether we need to run
    // the fixup for pops within blocks.
    scopeStack[0].notePop();
    push(builder.makePop(params));
  }

  return Ok{};
}